

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclLiberty.c
# Opt level: O0

int Scl_LibertyReadDeriveStrength(Scl_Tree_t *p,Scl_Item_t *pCell)

{
  int iVar1;
  char *__nptr;
  Scl_Item_t *local_28;
  Scl_Item_t *pItem;
  Scl_Item_t *pCell_local;
  Scl_Tree_t *p_local;
  
  local_28 = Scl_LibertyItem(p,pCell->Child);
  while( true ) {
    if (local_28 == (Scl_Item_t *)0x0) {
      return 0;
    }
    iVar1 = Scl_LibertyCompare(p,local_28->Key,"drive_strength");
    if (iVar1 == 0) break;
    local_28 = Scl_LibertyItem(p,local_28->Next);
  }
  __nptr = Scl_LibertyReadString(p,local_28->Head);
  iVar1 = atoi(__nptr);
  return iVar1;
}

Assistant:

int Scl_LibertyReadDeriveStrength( Scl_Tree_t * p, Scl_Item_t * pCell )
{
    Scl_Item_t * pItem;
    Scl_ItemForEachChildName( p, pCell, pItem, "drive_strength" )
        return atoi(Scl_LibertyReadString(p, pItem->Head));
    return 0;
}